

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask7_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = *in;
  *out = uVar2;
  uVar2 = in[1] << 7 | uVar2;
  *out = uVar2;
  uVar2 = in[2] << 0xe | uVar2;
  *out = uVar2;
  uVar2 = in[3] << 0x15 | uVar2;
  *out = uVar2;
  uVar1 = in[4];
  *out = uVar1 << 0x1c | uVar2;
  uVar1 = uVar1 >> 4;
  out[1] = uVar1;
  uVar1 = in[5] << 3 | uVar1;
  out[1] = uVar1;
  uVar1 = in[6] << 10 | uVar1;
  out[1] = uVar1;
  uVar1 = in[7] << 0x11 | uVar1;
  out[1] = uVar1;
  uVar1 = in[8] << 0x18 | uVar1;
  out[1] = uVar1;
  uVar2 = in[9];
  out[1] = uVar2 << 0x1f | uVar1;
  uVar2 = uVar2 >> 1;
  out[2] = uVar2;
  uVar2 = in[10] << 6 | uVar2;
  out[2] = uVar2;
  uVar2 = in[0xb] << 0xd | uVar2;
  out[2] = uVar2;
  uVar2 = in[0xc] << 0x14 | uVar2;
  out[2] = uVar2;
  uVar1 = in[0xd];
  out[2] = uVar1 << 0x1b | uVar2;
  uVar1 = uVar1 >> 5;
  out[3] = uVar1;
  uVar1 = in[0xe] << 2 | uVar1;
  out[3] = uVar1;
  out[3] = in[0xf] << 9 | uVar1;
  return out + 4;
}

Assistant:

uint32_t *__fastpackwithoutmask7_16(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 21;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (7 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 17;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (7 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (7 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 9;
  ++in;

  return out + 1;
}